

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

int check_control(char *s)

{
  char *__s1;
  int iVar1;
  size_t __n;
  int local_1c;
  int i;
  char *s_local;
  
  if (*s == '%') {
    local_1c = 0;
    while (deflist[local_1c].defname != (char *)0x0) {
      __s1 = deflist[local_1c].defname;
      __n = strlen(deflist[local_1c].defname);
      iVar1 = strncmp(__s1,s + 1,__n);
      if (iVar1 == 0) {
        return local_1c;
      }
      local_1c = local_1c + 1;
    }
  }
  return -1;
}

Assistant:

static int check_control(char *s)
{
	int	i;

	if (s[0] != '%') return -1;

	for (i = 0; deflist[i].defname; i++)
	    if (!strncmp(deflist[i].defname, s+1, strlen(deflist[i].defname)))
		return i;

	return -1;
}